

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O2

ImageList * __thiscall aeron::Subscription::addImage(Subscription *this,Image *image)

{
  ImageList *pIVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  size_t *psVar6;
  Image *pIVar7;
  size_t sVar8;
  __pointer_type pIVar9;
  size_t sVar10;
  Image *this_00;
  Image *image_00;
  long lVar11;
  Image *this_01;
  
  pIVar1 = (this->m_imageList)._M_b._M_p;
  sVar2 = pIVar1->m_length;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar2 + 1;
  uVar4 = SUB168(auVar3 * ZEXT816(0x128),0);
  uVar5 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  image_00 = pIVar1->m_images;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x128),8) == 0) {
    uVar4 = uVar5;
  }
  psVar6 = (size_t *)operator_new__(uVar4);
  pIVar7 = (Image *)(psVar6 + 1);
  sVar8 = sVar2 + 1;
  *psVar6 = sVar8;
  sVar10 = sVar2;
  this_01 = pIVar7;
  if (sVar8 != 0) {
    lVar11 = 0;
    this_00 = pIVar7;
    do {
      Image::Image(this_00);
      lVar11 = lVar11 + -0x128;
      this_00 = this_00 + 1;
    } while (sVar2 * -0x128 + -0x128 != lVar11);
  }
  while (sVar10 != 0) {
    Image::operator=(this_01,image_00);
    image_00 = image_00 + 1;
    sVar10 = sVar10 - 1;
    this_01 = this_01 + 1;
  }
  Image::operator=(pIVar7 + sVar2,image);
  pIVar9 = (__pointer_type)operator_new(0x10);
  pIVar9->m_images = pIVar7;
  pIVar9->m_length = sVar8;
  (this->m_imageList)._M_b._M_p = pIVar9;
  return pIVar1;
}

Assistant:

struct ImageList *addImage(Image &image)
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image *oldArray = oldImageList->m_images;
        std::size_t length = oldImageList->m_length;
        auto newArray = new Image[length + 1];

        for (std::size_t i = 0; i < length; i++)
        {
            newArray[i] = oldArray[i];
        }

        newArray[length] = image; // copy-assign

        auto newImageList = new struct ImageList(newArray, length + 1);

        std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);

        return oldImageList;
    }